

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_utils.cpp
# Opt level: O2

string * cornelich::make_file
                   (string *__return_storage_ptr__,string *base_path,string *cycle_string,
                   string *file_name,bool append)

{
  bool bVar1;
  path file;
  path dir;
  path local_80;
  path local_60;
  path local_40;
  
  std::__cxx11::string::string((string *)&local_80,(string *)base_path);
  std::__cxx11::string::string((string *)&local_60,(string *)cycle_string);
  boost::filesystem::operator/(&local_40,&local_80,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  if (!append) {
    std::__cxx11::string::string((string *)&local_60,(string *)file_name);
    boost::filesystem::operator/(&local_80,&local_40,&local_60);
    bVar1 = boost::filesystem::exists(&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    if (!bVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      goto LAB_00126c42;
    }
  }
  bVar1 = boost::filesystem::is_directory(&local_40);
  if (!bVar1) {
    boost::filesystem::create_directories(&local_40);
  }
  std::__cxx11::string::string((string *)&local_60,(string *)file_name);
  boost::filesystem::operator/(&local_80,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = boost::filesystem::exists(&local_80);
  if (bVar1 || append) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_80);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  std::__cxx11::string::~string((string *)&local_80);
LAB_00126c42:
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string make_file(const std::string & base_path,
                      const std::string & cycle_string,
                      const std::string & file_name,
                      bool append)
{
    const auto dir = fs::path(base_path) / cycle_string;
    if(!append && !fs::exists(dir / file_name))
    {
        return {};
    }

    if(!fs::is_directory(dir))
    {
        fs::create_directories(dir);
    }

    const auto file = dir / file_name;
    if(fs::exists(file))
    {
        // "File exists:" << file;
    }
    else if(append)
    {
        // "File does not exist: " << file;
    }
    else
    {
        return {};
    }
    return file.string();
}